

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  size_t *local_b0;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  size_t temp_dimension_index;
  size_t max_dimension_index;
  string shader_source;
  allocator<char> local_39;
  string local_38 [8];
  string example_struct;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  example_struct.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"struct light {\n    float[2] intensity;\n    int[2] position;\n} lightVar[2]"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&max_dimension_index);
  for (temp_dimension_index = 1; temp_dimension_index < 8;
      temp_dimension_index = temp_dimension_index + 1) {
    std::__cxx11::string::operator=((string *)&max_dimension_index,local_38);
    for (cs = (string *)0x0; cs < temp_dimension_index; cs = (string *)&cs->field_0x1) {
      std::__cxx11::string::operator+=((string *)&max_dimension_index,"[2]");
    }
    std::__cxx11::string::operator+=((string *)&max_dimension_index,";\n\n");
    std::__cxx11::string::operator+=
              ((string *)&max_dimension_index,(string *)shader_start_abi_cxx11_);
    switch(example_struct.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=
                ((string *)&max_dimension_index,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=
                ((string *)&max_dimension_index,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=
                ((string *)&max_dimension_index,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x5ba);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)&max_dimension_index,(string *)shader_end_abi_cxx11_)
    ;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    local_b0 = (size_t *)default_fragment_shader_source_abi_cxx11_;
    switch(example_struct.field_2._12_4_) {
    case 0:
      local_b0 = &max_dimension_index;
      break;
    case 1:
      tcs = (string *)&max_dimension_index;
      break;
    case 2:
      tcs = (string *)empty_string_abi_cxx11_;
      local_b0 = (size_t *)empty_string_abi_cxx11_;
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x5bd);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[9])(this,tcs,local_b0,1,0);
  }
  std::__cxx11::string::~string((string *)&max_dimension_index);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SizedDeclarationsStructTypes4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float[2] intensity;\n"
							   "    int[2] position;\n"
							   "} lightVar[2]");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;

		for (size_t temp_dimension_index = 0; temp_dimension_index < max_dimension_index; temp_dimension_index++)
		{
			shader_source += "[2]";
		}
		shader_source += ";\n\n";
		shader_source += shader_start;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}